

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_CorrelationMeter.cpp
# Opt level: O1

int CorrelationMeter::CreateCallback(UnityAudioEffectState *state)

{
  float *params;
  HistoryBuffer *this;
  long lVar1;
  
  params = (float *)operator_new(0x90);
  this = (HistoryBuffer *)(params + 2);
  lVar1 = 0;
  do {
    HistoryBuffer::HistoryBuffer(this);
    lVar1 = lVar1 + -0x10;
    this = this + 1;
  } while (lVar1 != -0x80);
  lVar1 = 0;
  memset(params,0,0x90);
  InitParametersFromDefinitions(InternalRegisterEffectDefinition,params);
  (state->field_0).field_0.effectdata = params;
  do {
    HistoryBuffer::Init((HistoryBuffer *)((long)params + lVar1 + 8),
                        (state->field_0).field_0.samplerate * 2);
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x80);
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK CreateCallback(UnityAudioEffectState* state)
    {
        EffectData* data = new EffectData;
        memset(data, 0, sizeof(EffectData));
        InitParametersFromDefinitions(InternalRegisterEffectDefinition, data->p);
        state->effectdata = data;
        for (int i = 0; i < 8; i++)
            data->history[i].Init(state->samplerate * 2);
        return UNITY_AUDIODSP_OK;
    }